

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O0

ctmbstr prvTidytmbsubstrn(ctmbstr s1,uint len1,ctmbstr s2)

{
  uint n;
  int iVar1;
  int local_30;
  int diff;
  int ix;
  uint len2;
  ctmbstr s2_local;
  uint len1_local;
  ctmbstr s1_local;
  
  n = prvTidytmbstrlen(s2);
  local_30 = 0;
  while( true ) {
    if ((int)(len1 - n) < local_30) {
      return (ctmbstr)0x0;
    }
    iVar1 = prvTidytmbstrncmp(s1 + local_30,s2,n);
    if (iVar1 == 0) break;
    local_30 = local_30 + 1;
  }
  return s1 + local_30;
}

Assistant:

ctmbstr TY_(tmbsubstrn)( ctmbstr s1, uint len1, ctmbstr s2 )
{
    uint len2 = TY_(tmbstrlen)(s2);
    int ix, diff = len1 - len2;

    for ( ix = 0; ix <= diff; ++ix )
    {
        if ( TY_(tmbstrncmp)(s1+ix, s2, len2) == 0 )
            return (ctmbstr) s1+ix;
    }
    return NULL;
}